

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

float __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,float,duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *accessor)

{
  DataChunk *pDVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  MadAccessor<float,_float,_float> *pMVar5;
  CURSOR *pCVar6;
  long lVar7;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp_01;
  bool bVar8;
  ulong uVar9;
  reference pvVar10;
  InvalidInputException *pIVar11;
  duckdb *pdVar12;
  float fVar13;
  float result_1;
  float local_7c;
  string local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_58._8_8_ = local_58._0_8_;
  bVar8 = this->desc;
  iVar2 = this->FRN;
  iVar3 = this->begin;
  iVar4 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar8;
  if (this->CRN == iVar2) {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar9 = (long)(iVar4 * 8 + iVar3 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar8;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    pMVar5 = accessor->outer;
    pCVar6 = accessor->inner->data;
    uVar9 = v_t[this->FRN];
    if (((pCVar6->scan).next_row_index <= uVar9) || (uVar9 < (pCVar6->scan).current_row_index)) {
      pDVar1 = &pCVar6->page;
      ColumnDataCollection::Seek(pCVar6->inputs,uVar9,&pCVar6->scan,pDVar1);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar6->data = (float *)pvVar10->data;
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar10);
      pCVar6->validity = &pvVar10->validity;
    }
    fVar13 = ABS(pCVar6->data[(uint)((int)uVar9 - (int)(pCVar6->scan).current_row_index)] -
                 *pMVar5->median);
    local_58 = ZEXT416((uint)fVar13);
    pdVar12 = (duckdb *)0x0;
    bVar8 = TryCast::Operation<float,float>(fVar13,&local_7c,false);
    if (!bVar8) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar12,(float)local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar9 = (long)(iVar4 * 8 + iVar3 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar8;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar2 = this->FRN;
    iVar3 = this->end;
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar8;
    if (this->CRN != iVar3 && iVar2 != iVar3) {
      uVar9 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar8;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar2,v_t + this->CRN,v_t + iVar3,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    local_58._0_8_ = accessor->outer;
    pCVar6 = accessor->inner->data;
    uVar9 = v_t[this->FRN];
    if (((pCVar6->scan).next_row_index <= uVar9) || (uVar9 < (pCVar6->scan).current_row_index)) {
      pDVar1 = &pCVar6->page;
      ColumnDataCollection::Seek(pCVar6->inputs,uVar9,&pCVar6->scan,pDVar1);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar6->data = (float *)pvVar10->data;
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar10);
      pCVar6->validity = &pvVar10->validity;
    }
    fVar13 = ABS(pCVar6->data[(uint)((int)uVar9 - (int)(pCVar6->scan).current_row_index)] -
                 *((MadAccessor<float,_float,_float> *)local_58._0_8_)->median);
    local_58 = ZEXT416((uint)fVar13);
    pdVar12 = (duckdb *)0x0;
    bVar8 = TryCast::Operation<float,float>(fVar13,&local_7c,false);
    if (!bVar8) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar12,(float)local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58._0_4_ = local_7c;
    pMVar5 = accessor->outer;
    pCVar6 = accessor->inner->data;
    uVar9 = v_t[this->CRN];
    if (((pCVar6->scan).next_row_index <= uVar9) || (uVar9 < (pCVar6->scan).current_row_index)) {
      pDVar1 = &pCVar6->page;
      ColumnDataCollection::Seek(pCVar6->inputs,uVar9,&pCVar6->scan,pDVar1);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar6->data = (float *)pvVar10->data;
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar10);
      pCVar6->validity = &pvVar10->validity;
    }
    fVar13 = ABS(pCVar6->data[(uint)((int)uVar9 - (int)(pCVar6->scan).current_row_index)] -
                 *pMVar5->median);
    local_48 = ZEXT416((uint)fVar13);
    pdVar12 = (duckdb *)0x0;
    bVar8 = TryCast::Operation<float,float>(fVar13,&local_7c,false);
    if (!bVar8) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar12,(float)local_48._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_7c = (float)((double)(local_7c - (float)local_58._0_4_) *
                       (this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                      (double)(float)local_58._0_4_);
  }
  return local_7c;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}